

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void bcd_sub(TCGContext_conflict2 *tcg_ctx,TCGv_i32 dest,TCGv_i32 src)

{
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  TCGv_i32 src_local;
  TCGv_i32 dest_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_subfi_i32_m68k(tcg_ctx,ret,0x1ff,src);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_add_i32(tcg_ctx,ret_00,ret,dest);
  tcg_gen_addi_i32_m68k(tcg_ctx,ret_00,ret_00,1);
  tcg_gen_sub_i32(tcg_ctx,ret_00,ret_00,QREG_CC_X);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_xor_i32(tcg_ctx,ret_01,ret,dest);
  tcg_gen_xor_i32(tcg_ctx,ret,ret_00,ret_01);
  tcg_gen_shri_i32_m68k(tcg_ctx,ret_01,ret,3);
  tcg_gen_not_i32(tcg_ctx,ret_01,ret_01);
  tcg_gen_andi_i32_m68k(tcg_ctx,ret_01,ret_01,0x22);
  tcg_gen_add_i32(tcg_ctx,ret,ret_01,ret_01);
  tcg_gen_add_i32(tcg_ctx,ret,ret,ret_01);
  tcg_temp_free_i32(tcg_ctx,ret_01);
  tcg_gen_sub_i32(tcg_ctx,dest,ret_00,ret);
  tcg_temp_free_i32(tcg_ctx,ret);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  return;
}

Assistant:

static void bcd_sub(TCGContext *tcg_ctx, TCGv dest, TCGv src)
{
    TCGv t0, t1, t2;

    /*
     *  dest10 = dest10 - src10 - X
     *         = bcd_add(tcg_ctx, dest + 1 - X, 0x199 - src)
     */

    /* t0 = 0x066 + (0x199 - src) */

    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_subfi_i32(tcg_ctx, t0, 0x1ff, src);

    /* t1 = t0 + dest + 1 - X*/

    t1 = tcg_temp_new(tcg_ctx);
    tcg_gen_add_i32(tcg_ctx, t1, t0, dest);
    tcg_gen_addi_i32(tcg_ctx, t1, t1, 1);
    tcg_gen_sub_i32(tcg_ctx, t1, t1, QREG_CC_X);

    /* t2 = t0 ^ dest */

    t2 = tcg_temp_new(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx, t2, t0, dest);

    /* t0 = t1 ^ t2 */

    tcg_gen_xor_i32(tcg_ctx, t0, t1, t2);

    /*
     * t2 = ~t0 & 0x110
     * t0 = (t2 >> 2) | (t2 >> 3)
     *
     * to fit on 8bit operands, changed in:
     *
     * t2 = ~(t0 >> 3) & 0x22
     * t0 = t2 + t2
     * t0 = t0 + t2
     */

    tcg_gen_shri_i32(tcg_ctx, t2, t0, 3);
    tcg_gen_not_i32(tcg_ctx, t2, t2);
    tcg_gen_andi_i32(tcg_ctx, t2, t2, 0x22);
    tcg_gen_add_i32(tcg_ctx, t0, t2, t2);
    tcg_gen_add_i32(tcg_ctx, t0, t0, t2);
    tcg_temp_free(tcg_ctx, t2);

    /* return t1 - t0 */

    tcg_gen_sub_i32(tcg_ctx, dest, t1, t0);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}